

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O1

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<2,_10,_6>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  undefined8 uVar1;
  int i;
  float *pfVar2;
  long lVar3;
  undefined4 *puVar4;
  long lVar5;
  float *pfVar6;
  long lVar7;
  undefined4 uVar8;
  Vector<float,_3> res;
  Type in1;
  Type in0;
  float afStack_c0 [6];
  Matrix<float,_3,_2> local_a8;
  Vec4 *local_90;
  float local_88 [5];
  float local_74 [3];
  Matrix<float,_4,_3> local_68;
  Vec4 *local_30;
  float local_28;
  float local_1c [2];
  float local_14;
  
  pfVar2 = (float *)&local_68;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar3 = 0;
    lVar5 = 0;
    do {
      lVar7 = 0;
      do {
        uVar8 = 0x3f800000;
        if (lVar3 != lVar7) {
          uVar8 = 0;
        }
        *(undefined4 *)((long)pfVar2 + lVar7) = uVar8;
        lVar7 = lVar7 + 0x10;
      } while (lVar7 != 0x30);
      lVar5 = lVar5 + 1;
      pfVar2 = pfVar2 + 1;
      lVar3 = lVar3 + 0x10;
    } while (lVar5 != 4);
    local_68.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
    local_68.m_data.m_data[0].m_data._8_8_ = *(undefined8 *)(evalCtx->in[0].m_data + 2);
    local_68.m_data.m_data[1].m_data._0_8_ = *(undefined8 *)evalCtx->in[1].m_data;
    local_68.m_data.m_data[1].m_data._8_8_ = *(undefined8 *)(evalCtx->in[1].m_data + 2);
    local_68.m_data.m_data[2].m_data._0_8_ = *(undefined8 *)evalCtx->in[2].m_data;
    local_68.m_data.m_data[2].m_data._8_8_ = *(undefined8 *)(evalCtx->in[2].m_data + 2);
  }
  else {
    local_68.m_data.m_data[2].m_data[0] = 0.0;
    local_68.m_data.m_data[2].m_data[1] = 0.0;
    local_68.m_data.m_data[2].m_data[2] = 0.0;
    local_68.m_data.m_data[2].m_data[3] = 0.0;
    local_68.m_data.m_data[1].m_data[0] = 0.0;
    local_68.m_data.m_data[1].m_data[1] = 0.0;
    local_68.m_data.m_data[1].m_data[2] = 0.0;
    local_68.m_data.m_data[1].m_data[3] = 0.0;
    local_68.m_data.m_data[0].m_data[0] = 0.0;
    local_68.m_data.m_data[0].m_data[1] = 0.0;
    local_68.m_data.m_data[0].m_data[2] = 0.0;
    local_68.m_data.m_data[0].m_data[3] = 0.0;
    puVar4 = &sr::(anonymous_namespace)::s_constInMat3x4;
    lVar3 = 0;
    do {
      lVar5 = 0;
      do {
        pfVar2[lVar5] = *(float *)((long)puVar4 + lVar5);
        lVar5 = lVar5 + 4;
      } while (lVar5 != 0xc);
      lVar3 = lVar3 + 1;
      pfVar2 = pfVar2 + 1;
      puVar4 = puVar4 + 3;
    } while (lVar3 != 4);
  }
  pfVar2 = (float *)&local_a8;
  if (in1Type == INPUTTYPE_DYNAMIC) {
    lVar3 = 0;
    lVar5 = 0;
    do {
      lVar7 = 0;
      do {
        uVar8 = 0x3f800000;
        if (lVar3 != lVar7) {
          uVar8 = 0;
        }
        *(undefined4 *)((long)pfVar2 + lVar7) = uVar8;
        lVar7 = lVar7 + 0xc;
      } while (lVar7 == 0xc);
      lVar5 = lVar5 + 1;
      pfVar2 = pfVar2 + 1;
      lVar3 = lVar3 + 0xc;
    } while (lVar5 != 3);
    local_a8.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
    local_a8.m_data.m_data[0].m_data[2] = evalCtx->in[0].m_data[2];
    uVar1 = *(undefined8 *)evalCtx->in[1].m_data;
    local_a8.m_data.m_data[1].m_data[2] = evalCtx->in[1].m_data[2];
    local_a8.m_data.m_data[1].m_data[0] = (float)uVar1;
    local_a8.m_data.m_data[1].m_data[1] = (float)((ulong)uVar1 >> 0x20);
  }
  else {
    local_a8.m_data.m_data[0].m_data[0] = 0.0;
    local_a8.m_data.m_data[0].m_data[1] = 0.0;
    local_a8.m_data.m_data[0].m_data[2] = 0.0;
    local_a8.m_data.m_data[1].m_data[0] = 0.0;
    local_a8.m_data.m_data[1].m_data[1] = 0.0;
    local_a8.m_data.m_data[1].m_data[2] = 0.0;
    puVar4 = &DAT_00b4c2a8;
    lVar3 = 0;
    do {
      lVar5 = 0;
      pfVar6 = pfVar2;
      do {
        *pfVar6 = (float)puVar4[lVar5];
        lVar5 = lVar5 + 1;
        pfVar6 = pfVar6 + 3;
      } while (lVar5 == 1);
      lVar3 = lVar3 + 1;
      pfVar2 = pfVar2 + 1;
      puVar4 = puVar4 + 2;
    } while (lVar3 != 3);
  }
  afStack_c0[0] = 8.535288e-39;
  afStack_c0[1] = 0.0;
  tcu::operator*((Matrix<float,_4,_2> *)&local_30,&local_68,&local_a8);
  local_90 = local_30;
  local_88[0] = local_28;
  local_74[0] = local_1c[0];
  local_74[1] = local_1c[1];
  local_74[2] = local_14;
  afStack_c0[2] = 0.0;
  afStack_c0[3] = 0.0;
  afStack_c0[4] = 0.0;
  lVar3 = 0;
  do {
    afStack_c0[lVar3 + 2] = *(float *)((long)&local_90 + lVar3 * 4) + local_74[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_90 = &evalCtx->color;
  local_88[0] = 0.0;
  local_88[1] = 1.4013e-45;
  local_88[2] = 2.8026e-45;
  lVar3 = 2;
  do {
    (evalCtx->color).m_data[*(int *)((long)&local_90 + lVar3 * 4)] = afStack_c0[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 * in1);
	}